

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.h
# Opt level: O0

bool Recognition::is_id(string *str)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  bool bVar3;
  long lVar4;
  invalid_argument *this;
  char *pcVar5;
  bool local_b9;
  basic_regex<char,_std::__cxx11::regex_traits<char>_> local_90;
  byte local_69;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_regex<char,_std::__cxx11::regex_traits<char>_> local_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_18;
  string *str_local;
  
  local_18 = str;
  lVar4 = std::__cxx11::string::length();
  pbVar2 = local_18;
  if (lVar4 != 0) {
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
              (&local_48,"^\\w+$",0x10);
    local_69 = 0;
    bVar1 = false;
    bVar3 = std::
            regex_match<std::char_traits<char>,std::allocator<char>,char,std::__cxx11::regex_traits<char>>
                      (pbVar2,&local_48,0);
    pbVar2 = local_18;
    local_b9 = false;
    if (bVar3) {
      std::__cxx11::string::length();
      pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)pbVar2);
      local_b9 = false;
      if (*pcVar5 != '_') {
        std::__cxx11::string::substr((ulong)&local_68,(ulong)local_18);
        local_69 = 1;
        std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
                  (&local_90,"[A-Za-z]",0x10);
        bVar1 = true;
        local_b9 = std::
                   regex_match<std::char_traits<char>,std::allocator<char>,char,std::__cxx11::regex_traits<char>>
                             (&local_68,&local_90,0);
      }
    }
    str_local._7_1_ = local_b9;
    if (bVar1) {
      std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex(&local_90);
    }
    if ((local_69 & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_68);
    }
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex(&local_48);
    return (bool)(str_local._7_1_ & 1);
  }
  this = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(this,"received empty string value");
  __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

static bool is_id(const std::string &str) {
        if (str.length() == 0) {
            throw std::invalid_argument("received empty string value");
        }
        return std::regex_match(str, std::regex("^\\w+$")) && str[str.length()-1] != '_' &&
                std::regex_match(str.substr(0, 1), std::regex("[A-Za-z]"));
    }